

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
tf::SmallVectorImpl<tf::Node*>::append<tf::Node**>
          (SmallVectorImpl<tf::Node_*> *this,Node **in_start,Node **in_end)

{
  ulong uVar1;
  iterator ppNVar2;
  iterator ppNVar3;
  Node **in_RDX;
  type *in_RSI;
  SmallVectorTemplateCommon<tf::Node_*,_void> *in_RDI;
  size_type NumInputs;
  size_t in_stack_ffffffffffffffb8;
  SmallVectorTemplateCommon<tf::Node_*,_void> *in_stack_ffffffffffffffc0;
  Node **in_stack_ffffffffffffffd0;
  
  uVar1 = std::distance<tf::Node**>(in_stack_ffffffffffffffd0,(Node **)in_RDI);
  ppNVar2 = SmallVectorTemplateCommon<tf::Node_*,_void>::capacity_ptr(in_RDI);
  ppNVar3 = SmallVectorTemplateCommon<tf::Node_*,_void>::end(in_RDI);
  if ((ulong)((long)ppNVar2 - (long)ppNVar3 >> 3) < uVar1) {
    SmallVectorTemplateCommon<tf::Node_*,_void>::size(in_stack_ffffffffffffffc0);
    SmallVectorTemplateBase<tf::Node_*,_true>::grow
              ((SmallVectorTemplateBase<tf::Node_*,_true> *)in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8);
  }
  SmallVectorTemplateCommon<tf::Node_*,_void>::end(in_RDI);
  SmallVectorTemplateBase<tf::Node*,true>::uninitialized_copy<tf::Node*,tf::Node*>
            (ppNVar2,(Node **)in_RDI,in_RDX,in_RSI);
  ppNVar2 = SmallVectorTemplateCommon<tf::Node_*,_void>::end(in_RDI);
  SmallVectorTemplateCommon<tf::Node_*,_void>::setEnd(in_RDI,ppNVar2 + uVar1);
  return;
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > size_type(this->capacity_ptr()-this->end()))
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->setEnd(this->end() + NumInputs);
  }